

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::ExceptionCallback::ExceptionCallback(ExceptionCallback *this)

{
  ExceptionCallback *pEVar1;
  long *in_FS_OFFSET;
  Fault local_28;
  Fault f;
  ptrdiff_t offset;
  ExceptionCallback *pEStack_10;
  char stackVar;
  ExceptionCallback *this_local;
  
  this->_vptr_ExceptionCallback = (_func_int **)&PTR__ExceptionCallback_003a7510;
  pEStack_10 = this;
  pEVar1 = getExceptionCallback();
  this->next = pEVar1;
  f.exception = (Exception *)((long)this - ((long)&offset + 7));
  if (0xffff < (long)f.exception || (long)f.exception < -0xffff) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x2f0,FAILED,"offset < 65536 && offset > -65536",
               "\"ExceptionCallback must be allocated on the stack.\"",
               (char (*) [50])"ExceptionCallback must be allocated on the stack.");
    _::Debug::Fault::fatal(&local_28);
  }
  *(ExceptionCallback **)(*in_FS_OFFSET + -8) = this;
  return;
}

Assistant:

ExceptionCallback::ExceptionCallback(): next(getExceptionCallback()) {
  char stackVar;
  ptrdiff_t offset = reinterpret_cast<char*>(this) - &stackVar;
  KJ_ASSERT(offset < 65536 && offset > -65536,
            "ExceptionCallback must be allocated on the stack.");

  threadLocalCallback = this;
}